

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

char __thiscall
cs_impl::cni_helper<char_(*)(const_cs::numeric_&),_char_(*)(const_cs::numeric_&)>::_call<0>
          (cni_helper<char_(*)(const_cs::numeric_&),_char_(*)(const_cs::numeric_&)> *this,
          vector *args,sequence<0> *param_3)

{
  char *pcVar1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  numeric *in_RDI;
  var *in_stack_000000f0;
  undefined7 in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe7;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
  try_convert_and_check<const_cs::numeric_&,_const_cs::numeric_&,_cs::numeric,_0UL>::convert
            (in_stack_000000f0);
  std::function<char_(const_cs::numeric_&)>::operator()
            ((function<char_(const_cs::numeric_&)> *)
             CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),in_RDI);
  pcVar1 = type_convertor<char,_char>::convert<char>(&stack0xffffffffffffffe7);
  return *pcVar1;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}